

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack13_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  uVar2 = (in[1] - base) * 0x2000 | uVar1 - base;
  *out = uVar2;
  *out = (in[2] - base) * 0x4000000 | uVar2;
  uVar2 = in[2] - base >> 6;
  out[1] = uVar2;
  uVar2 = (in[3] - base) * 0x80 | uVar2;
  out[1] = uVar2;
  out[1] = (in[4] - base) * 0x100000 | uVar2;
  uVar2 = in[4] - base >> 0xc;
  out[2] = uVar2;
  uVar2 = (in[5] - base) * 2 | uVar2;
  out[2] = uVar2;
  uVar2 = (in[6] - base) * 0x4000 | uVar2;
  out[2] = uVar2;
  out[2] = (in[7] - base) * 0x8000000 | uVar2;
  out[3] = in[7] - base >> 5;
  return out + 4;
}

Assistant:

uint32_t * pack13_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 13  -  7 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 13  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 13  -  8 );
    ++in;

    return out + 1;
}